

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-million-timers.c
# Opt level: O0

int run_benchmark_million_timers(void)

{
  int iVar1;
  void *__ptr;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  void *eval_b;
  void *eval_a;
  int i;
  int timeout;
  uint64_t after_all;
  uint64_t after_run;
  uint64_t before_run;
  uint64_t before_all;
  uv_loop_t *loop;
  uv_timer_t *timers;
  
  __ptr = malloc(1520000000);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
            ,0x34,"timers","!=","NULL",0,"!=",0);
    abort();
  }
  puVar2 = uv_default_loop();
  eval_a._4_4_ = 0;
  uVar3 = uv_hrtime();
  for (eval_a._0_4_ = 0; (int)eval_a < 10000000; eval_a._0_4_ = (int)eval_a + 1) {
    if ((int)eval_a % 1000 == 0) {
      eval_a._4_4_ = eval_a._4_4_ + 1;
    }
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)((long)__ptr + (long)(int)eval_a * 0x98));
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
              ,0x3c,"0 == uv_timer_init(loop, timers + i)");
      abort();
    }
    iVar1 = uv_timer_start((uv_timer_t *)((long)__ptr + (long)(int)eval_a * 0x98),timer_cb,
                           (long)eval_a._4_4_,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
              ,0x3d,"0 == uv_timer_start(timers + i, timer_cb, timeout, 0)");
      abort();
    }
  }
  uVar4 = uv_hrtime();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
            ,0x41,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  uVar5 = uv_hrtime();
  for (eval_a._0_4_ = 0; (int)eval_a < 10000000; eval_a._0_4_ = (int)eval_a + 1) {
    uv_close((uv_handle_t *)((long)__ptr + (long)(int)eval_a * 0x98),close_cb);
  }
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
            ,0x47,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  uVar6 = uv_hrtime();
  if (timer_cb_called != 10000000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
            ,0x4a,"timer_cb_called == NUM_TIMERS");
    abort();
  }
  if (close_cb_called != 10000000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
            ,0x4b,"close_cb_called == NUM_TIMERS");
    abort();
  }
  free(__ptr);
  lVar7 = uVar6 - uVar3;
  auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar8._0_8_ = lVar7;
  auVar8._12_4_ = 0x45300000;
  fprintf(_stderr,"%.2f seconds total\n",
          ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
  lVar7 = uVar4 - uVar3;
  auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar9._0_8_ = lVar7;
  auVar9._12_4_ = 0x45300000;
  fprintf(_stderr,"%.2f seconds init\n",
          ((auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
  lVar7 = uVar5 - uVar4;
  auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar10._0_8_ = lVar7;
  auVar10._12_4_ = 0x45300000;
  fprintf(_stderr,"%.2f seconds dispatch\n",
          ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
  lVar7 = uVar6 - uVar5;
  auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar11._0_8_ = lVar7;
  auVar11._12_4_ = 0x45300000;
  fprintf(_stderr,"%.2f seconds cleanup\n",
          ((auVar11._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
  fflush(_stderr);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
            ,0x54,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

BENCHMARK_IMPL(million_timers) {
  uv_timer_t* timers;
  uv_loop_t* loop;
  uint64_t before_all;
  uint64_t before_run;
  uint64_t after_run;
  uint64_t after_all;
  int timeout;
  int i;

  timers = malloc(NUM_TIMERS * sizeof(timers[0]));
  ASSERT_NOT_NULL(timers);

  loop = uv_default_loop();
  timeout = 0;

  before_all = uv_hrtime();
  for (i = 0; i < NUM_TIMERS; i++) {
    if (i % 1000 == 0) timeout++;
    ASSERT(0 == uv_timer_init(loop, timers + i));
    ASSERT(0 == uv_timer_start(timers + i, timer_cb, timeout, 0));
  }

  before_run = uv_hrtime();
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  after_run = uv_hrtime();

  for (i = 0; i < NUM_TIMERS; i++)
    uv_close((uv_handle_t*) (timers + i), close_cb);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  after_all = uv_hrtime();

  ASSERT(timer_cb_called == NUM_TIMERS);
  ASSERT(close_cb_called == NUM_TIMERS);
  free(timers);

  fprintf(stderr, "%.2f seconds total\n", (after_all - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds init\n", (before_run - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds dispatch\n", (after_run - before_run) / 1e9);
  fprintf(stderr, "%.2f seconds cleanup\n", (after_all - after_run) / 1e9);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}